

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O3

REF_STATUS ref_face_create(REF_FACE *ref_face_ptr,REF_GRID ref_grid)

{
  REF_CELL pRVar1;
  REF_INT *pRVar2;
  uint uVar3;
  int iVar4;
  REF_FACE ref_face;
  REF_INT *pRVar5;
  long lVar6;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  REF_CELL *ppRVar14;
  REF_INT nodes [4];
  REF_INT local_48 [6];
  
  ref_face = (REF_FACE)malloc(0x18);
  *ref_face_ptr = ref_face;
  if (ref_face == (REF_FACE)0x0) {
    pcVar11 = "malloc *ref_face_ptr of REF_FACE_STRUCT NULL";
    uVar7 = 0x24;
  }
  else {
    ref_face->n = 0;
    ref_face->max = 10;
    pRVar5 = (REF_INT *)malloc(0xa0);
    ref_face->f2n = pRVar5;
    if (pRVar5 != (REF_INT *)0x0) {
      uVar3 = ref_adj_create(&ref_face->adj);
      if (uVar3 != 0) {
        uVar9 = (ulong)uVar3;
        pcVar11 = "create adj";
        uVar7 = 0x2d;
LAB_001c8f4f:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",
               uVar7,"ref_face_create",uVar9,pcVar11);
        return (REF_STATUS)uVar9;
      }
      if (ref_grid->twod == 0) {
        ppRVar14 = ref_grid->cell + 8;
        lVar6 = 8;
        do {
          pRVar1 = *ppRVar14;
          iVar4 = pRVar1->max;
          if (0 < iVar4) {
            iVar10 = 0;
            do {
              if ((pRVar1->c2n[(long)pRVar1->size_per * (long)iVar10] != -1) &&
                 (0 < pRVar1->face_per)) {
                lVar13 = 0;
                lVar12 = 0;
                do {
                  pRVar5 = pRVar1->c2n;
                  pRVar2 = pRVar1->f2n;
                  lVar8 = 0;
                  do {
                    local_48[lVar8] =
                         pRVar5[(long)pRVar1->size_per * (long)iVar10 +
                                (long)*(int *)((long)pRVar2 + lVar8 * 4 + lVar13)];
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                  uVar3 = ref_face_add_uniquely(ref_face,local_48);
                  if (uVar3 != 0) {
                    uVar9 = (ulong)uVar3;
                    pcVar11 = "add face";
                    uVar7 = 0x41;
                    goto LAB_001c8f4f;
                  }
                  lVar12 = lVar12 + 1;
                  lVar13 = lVar13 + 0x10;
                } while (lVar12 < pRVar1->face_per);
                iVar4 = pRVar1->max;
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < iVar4);
          }
          ppRVar14 = ref_grid->cell + lVar6 + 1;
          lVar6 = lVar6 + 1;
          if (lVar6 == 0x10) {
            return 0;
          }
        } while( true );
      }
      ppRVar14 = ref_grid->cell + 3;
      lVar6 = 3;
      do {
        pRVar1 = *ppRVar14;
        iVar4 = pRVar1->max;
        if (0 < iVar4) {
          iVar10 = 0;
          do {
            if ((pRVar1->c2n[(long)pRVar1->size_per * (long)iVar10] != -1) && (0 < pRVar1->face_per)
               ) {
              lVar13 = 0;
              lVar12 = 0;
              do {
                pRVar5 = pRVar1->c2n;
                pRVar2 = pRVar1->f2n;
                lVar8 = 0;
                do {
                  local_48[lVar8] =
                       pRVar5[(long)pRVar1->size_per * (long)iVar10 +
                              (long)*(int *)((long)pRVar2 + lVar8 * 4 + lVar13)];
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                uVar3 = ref_face_add_uniquely(ref_face,local_48);
                if (uVar3 != 0) {
                  uVar9 = (ulong)uVar3;
                  pcVar11 = "add face";
                  uVar7 = 0x36;
                  goto LAB_001c8f4f;
                }
                lVar12 = lVar12 + 1;
                lVar13 = lVar13 + 0x10;
              } while (lVar12 < pRVar1->face_per);
              iVar4 = pRVar1->max;
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < iVar4);
        }
        ppRVar14 = ref_grid->cell + lVar6 + 1;
        lVar6 = lVar6 + 1;
        if (lVar6 == 8) {
          return 0;
        }
      } while( true );
    }
    pcVar11 = "malloc ref_face->f2n of REF_INT NULL";
    uVar7 = 0x2b;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",uVar7,
         "ref_face_create",pcVar11);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_face_create(REF_FACE *ref_face_ptr, REF_GRID ref_grid) {
  REF_FACE ref_face;
  REF_INT group, cell, cell_face;
  REF_INT node;
  REF_INT nodes[4];
  REF_CELL ref_cell;

  ref_malloc(*ref_face_ptr, 1, REF_FACE_STRUCT);

  ref_face = *ref_face_ptr;

  ref_face_n(ref_face) = 0;
  ref_face_max(ref_face) = 10;

  ref_malloc(ref_face->f2n, 4 * ref_face_max(ref_face), REF_INT);

  RSS(ref_adj_create(&(ref_face_adj(ref_face))), "create adj");

  if (ref_grid_twod(ref_grid)) {
    each_ref_grid_2d_ref_cell(ref_grid, group, ref_cell) {
      each_ref_cell_valid_cell(ref_cell, cell) {
        each_ref_cell_cell_face(ref_cell, cell_face) {
          for (node = 0; node < 4; node++) {
            nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
          }
          RSS(ref_face_add_uniquely(ref_face, nodes), "add face");
        }
      }
    }
  } else {
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      each_ref_cell_valid_cell(ref_cell, cell) {
        each_ref_cell_cell_face(ref_cell, cell_face) {
          for (node = 0; node < 4; node++) {
            nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
          }
          RSS(ref_face_add_uniquely(ref_face, nodes), "add face");
        }
      }
    }
  }

  return REF_SUCCESS;
}